

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_parse.c
# Opt level: O3

C_Node * add(C_Parser *parser,C_Token **rest,C_Token *tok)

{
  C_Token *tok_00;
  _Bool _Var1;
  C_Node *lhs;
  C_Node *pCVar2;
  C_Token *local_38;
  
  local_38 = tok;
  lhs = mul(parser,&local_38,tok);
  while( true ) {
    while( true ) {
      tok_00 = local_38;
      _Var1 = C_equal(local_38,"+");
      if (!_Var1) break;
      pCVar2 = mul(parser,&local_38,tok_00->next);
      lhs = new_add(parser,lhs,pCVar2,tok_00);
    }
    _Var1 = C_equal(tok_00,"-");
    if (!_Var1) break;
    pCVar2 = mul(parser,&local_38,tok_00->next);
    lhs = new_sub(parser,lhs,pCVar2,tok_00);
  }
  *rest = tok_00;
  return lhs;
}

Assistant:

static C_Node *add(C_Parser *parser, C_Token **rest, C_Token *tok) {
  C_Node *node = mul(parser, &tok, tok);

  for (;;) {
    C_Token *start = tok;

    if (C_equal(tok, "+")) {
      node = new_add(parser, node, mul(parser, &tok, tok->next), start);
      continue;
    }

    if (C_equal(tok, "-")) {
      node = new_sub(parser, node, mul(parser, &tok, tok->next), start);
      continue;
    }

    *rest = tok;
    return node;
  }
}